

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.hpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::CompilerHLSL(CompilerHLSL *this,ParsedIR *ir_)

{
  ParsedIR *ir__local;
  CompilerHLSL *this_local;
  
  CompilerGLSL::CompilerGLSL(&this->super_CompilerGLSL,ir_);
  (this->super_CompilerGLSL).super_Compiler._vptr_Compiler =
       (_func_int **)&PTR__CompilerHLSL_00598520;
  Options::Options((Options *)&(this->super_CompilerGLSL).field_0x241c);
  this->requires_op_fmod = false;
  this->requires_fp16_packing = false;
  this->requires_uint2_packing = false;
  this->requires_explicit_fp16_packing = false;
  this->requires_unorm8_packing = false;
  this->requires_snorm8_packing = false;
  this->requires_unorm16_packing = false;
  this->requires_snorm16_packing = false;
  this->requires_bitfield_insert = false;
  this->requires_bitfield_extract = false;
  this->requires_inverse_2x2 = false;
  this->requires_inverse_3x3 = false;
  this->requires_inverse_4x4 = false;
  this->requires_scalar_reflect = false;
  this->requires_scalar_refract = false;
  this->requires_scalar_faceforward = false;
  TextureSizeVariants::TextureSizeVariants(&this->required_texture_size_variants);
  this->require_output = false;
  this->require_input = false;
  SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL>::SmallVector
            (&this->remap_vertex_attributes);
  this->num_workgroups_builtin = 0;
  this->resource_binding_flags = 0;
  ::std::vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>::vector
            (&this->root_constants_layout);
  this->unique_identifier_count = 0;
  ::std::
  unordered_map<spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>_>_>
  ::unordered_map(&this->resource_bindings);
  ::std::
  unordered_set<spirv_cross::SetBindingPair,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::SetBindingPair>,_std::allocator<spirv_cross::SetBindingPair>_>
  ::unordered_set(&this->force_uav_buffer_bindings);
  return;
}

Assistant:

explicit CompilerHLSL(ParsedIR &&ir_)
	    : CompilerGLSL(std::move(ir_))
	{
	}